

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O2

void __thiscall
Assimp::TextureTransformStep::PreProcessUVTransform
          (TextureTransformStep *this,STransformVecInfo *info)

{
  aiTextureMapMode aVar1;
  uint uVar2;
  Logger *pLVar3;
  ostream *this_00;
  char *pcVar4;
  ai_real *s;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  char szTemp [512];
  char *local_3b8 [4];
  char local_398 [512];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_198 [376];
  
  fVar6 = (info->super_aiUVTransform).mRotation;
  fVar5 = 0.0;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    s = &(info->super_aiUVTransform).mRotation;
    if ((int)(fVar6 / 6.2831855) != 0) {
      pLVar3 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[29]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (char (*) [29])"Texture coordinate rotation ");
      this_00 = (ostream *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(local_198,s);
      std::operator<<(this_00," can be simplified to ");
      fVar6 = fVar6 + (float)(int)(fVar6 / 6.2831855) * -3.1415927;
      std::ostream::operator<<(this_00,fVar6);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar3,local_3b8[0]);
      std::__cxx11::string::~string((string *)local_3b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    }
    *s = (ai_real)(~-(uint)(fVar6 < 0.0) & (uint)fVar6 |
                  (uint)(fVar6 + 12.566371) & -(uint)(fVar6 < 0.0));
    return;
  }
  fVar6 = (info->super_aiUVTransform).mTranslation.x;
  uVar2 = (uint)fVar6;
  if (uVar2 != 0) {
    local_398[0] = '\0';
    aVar1 = info->mapU;
    if (aVar1 == aiTextureMapMode_Wrap) {
      uVar7 = SUB84((double)fVar6,0);
      pcVar4 = "[w] UV U offset %f can be simplified to %f";
LAB_0014d2d6:
      fVar5 = fVar6 - (float)(int)uVar2;
      snprintf(local_398,0x200,pcVar4,uVar7,(double)fVar5);
    }
    else {
      if (uVar2 != 1 && aVar1 == aiTextureMapMode_Mirror) {
        uVar2 = uVar2 & 0xfffffffe;
        uVar7 = SUB84((double)fVar6,0);
        pcVar4 = "[m/d] UV U offset %f can be simplified to %f";
        goto LAB_0014d2d6;
      }
      if ((aVar1 | aiTextureMapMode_Mirror) == aiTextureMapMode_Decal) {
        snprintf(local_398,0x200,"[c] UV U offset %f can be clamped to 1.0f",SUB84((double)fVar6,0))
        ;
        fVar5 = 1.0;
      }
    }
    if (local_398[0] != '\0') {
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,local_398);
      (info->super_aiUVTransform).mTranslation.x = fVar5;
    }
  }
  fVar6 = (info->super_aiUVTransform).mTranslation.y;
  uVar2 = (uint)fVar6;
  if (uVar2 == 0) {
    return;
  }
  local_398[0] = '\0';
  aVar1 = info->mapV;
  if (aVar1 == aiTextureMapMode_Wrap) {
    uVar7 = SUB84((double)fVar6,0);
    fVar5 = fVar6 - (float)(int)uVar2;
    pcVar4 = "[w] UV V offset %f can be simplified to %f";
  }
  else {
    if (uVar2 == 1 || aVar1 != aiTextureMapMode_Mirror) {
      if ((aVar1 | aiTextureMapMode_Mirror) == aiTextureMapMode_Decal) {
        snprintf(local_398,0x200,"[c] UV V offset %f canbe clamped to 1.0f",SUB84((double)fVar6,0));
        fVar5 = 1.0;
      }
      else {
        fVar5 = 0.0;
      }
      goto LAB_0014d3fa;
    }
    fVar5 = (info->super_aiUVTransform).mTranslation.x - (float)(int)(uVar2 & 0xfffffffe);
    uVar7 = SUB84((double)fVar6,0);
    pcVar4 = "[m/d] UV V offset %f can be simplified to %f";
  }
  snprintf(local_398,0x200,pcVar4,uVar7,(double)fVar5);
LAB_0014d3fa:
  if (local_398[0] != '\0') {
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,local_398);
    (info->super_aiUVTransform).mTranslation.y = fVar5;
  }
  return;
}

Assistant:

void TextureTransformStep::PreProcessUVTransform(STransformVecInfo& info)
{
    /*  This function tries to simplify the input UV transformation.
     *  That's very important as it allows us to reduce the number
     *  of output UV channels. The order in which the transformations
     *  are applied is - as always - scaling, rotation, translation.
     */

    char szTemp[512];
    int rounded = 0;


    /* Optimize the rotation angle. That's slightly difficult as
     * we have an inprecise floating-point number (when comparing
     * UV transformations we'll take that into account by using
     * an epsilon of 5 degrees). If there is a rotation value, we can't
     * perform any further optimizations.
     */
    if (info.mRotation)
    {
        float out = info.mRotation;
        if ((rounded = static_cast<int>((info.mRotation / static_cast<float>(AI_MATH_TWO_PI)))))
        {
            out -= rounded * static_cast<float>(AI_MATH_PI);
            ASSIMP_LOG_INFO_F("Texture coordinate rotation ", info.mRotation, " can be simplified to ", out);
        }

        // Next step - convert negative rotation angles to positives
        if (out < 0.f)
            out = (float)AI_MATH_TWO_PI * 2 + out;

        info.mRotation = out;
        return;
    }


    /* Optimize UV translation in the U direction. To determine whether
     * or not we can optimize we need to look at the requested mapping
     * type (e.g. if mirroring is active there IS a difference between
     * offset 2 and 3)
     */
    if ((rounded  = (int)info.mTranslation.x))  {
        float out = 0.0f;
        szTemp[0] = 0;
        if (aiTextureMapMode_Wrap == info.mapU) {
            // Wrap - simple take the fraction of the field
            out = info.mTranslation.x-(float)rounded;
			ai_snprintf(szTemp, 512, "[w] UV U offset %f can be simplified to %f", info.mTranslation.x, out);
        }
        else if (aiTextureMapMode_Mirror == info.mapU && 1 != rounded)  {
            // Mirror
            if (rounded % 2)
                rounded--;
            out = info.mTranslation.x-(float)rounded;

            ai_snprintf(szTemp,512,"[m/d] UV U offset %f can be simplified to %f",info.mTranslation.x,out);
        }
        else if (aiTextureMapMode_Clamp == info.mapU || aiTextureMapMode_Decal == info.mapU)    {
            // Clamp - translations beyond 1,1 are senseless
            ai_snprintf(szTemp,512,"[c] UV U offset %f can be clamped to 1.0f",info.mTranslation.x);

            out = 1.f;
        }
        if (szTemp[0])      {
            ASSIMP_LOG_INFO(szTemp);
            info.mTranslation.x = out;
        }
    }

    /* Optimize UV translation in the V direction. To determine whether
     * or not we can optimize we need to look at the requested mapping
     * type (e.g. if mirroring is active there IS a difference between
     * offset 2 and 3)
     */
    if ((rounded  = (int)info.mTranslation.y))  {
        float out = 0.0f;
        szTemp[0] = 0;
        if (aiTextureMapMode_Wrap == info.mapV) {
            // Wrap - simple take the fraction of the field
            out = info.mTranslation.y-(float)rounded;
            ::ai_snprintf(szTemp,512,"[w] UV V offset %f can be simplified to %f",info.mTranslation.y,out);
        }
        else if (aiTextureMapMode_Mirror == info.mapV  && 1 != rounded) {
            // Mirror
            if (rounded % 2)
                rounded--;
            out = info.mTranslation.x-(float)rounded;

            ::ai_snprintf(szTemp,512,"[m/d] UV V offset %f can be simplified to %f",info.mTranslation.y,out);
        }
        else if (aiTextureMapMode_Clamp == info.mapV || aiTextureMapMode_Decal == info.mapV)    {
            // Clamp - translations beyond 1,1 are senseless
            ::ai_snprintf(szTemp,512,"[c] UV V offset %f canbe clamped to 1.0f",info.mTranslation.y);

            out = 1.f;
        }
        if (szTemp[0])  {
            ASSIMP_LOG_INFO(szTemp);
            info.mTranslation.y = out;
        }
    }
    return;
}